

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirewirePort.cpp
# Opt level: O3

void __thiscall FirewirePort::Cleanup(FirewirePort *this)

{
  pointer __src;
  ostream *this_00;
  __normal_iterator<FirewirePort_**,_std::vector<FirewirePort_*,_std::allocator<FirewirePort_*>_>_>
  __dest;
  long *plVar1;
  
  __dest = std::
           __find_if<__gnu_cxx::__normal_iterator<FirewirePort**,std::vector<FirewirePort*,std::allocator<FirewirePort*>>>,__gnu_cxx::__ops::_Iter_equals_val<FirewirePort*const>>
                     (PortList.super__Vector_base<FirewirePort_*,_std::allocator<FirewirePort_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      PortList.super__Vector_base<FirewirePort_*,_std::allocator<FirewirePort_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish);
  if (__dest._M_current ==
      PortList.super__Vector_base<FirewirePort_*,_std::allocator<FirewirePort_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    this_00 = (this->super_BasePort).outStr;
    std::__ostream_insert<char,std::char_traits<char>>
              (this_00,"FirewirePort::Cleanup: could not find entry for port ",0x35);
    plVar1 = (long *)std::ostream::operator<<((ostream *)this_00,(this->super_BasePort).PortNum);
    std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
    std::ostream::put((char)plVar1);
    std::ostream::flush();
  }
  else {
    __src = __dest._M_current + 1;
    if (__src != PortList.super__Vector_base<FirewirePort_*,_std::allocator<FirewirePort_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish) {
      memmove(__dest._M_current,__src,
              (long)PortList.super__Vector_base<FirewirePort_*,_std::allocator<FirewirePort_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)__src);
    }
    PortList.super__Vector_base<FirewirePort_*,_std::allocator<FirewirePort_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         PortList.super__Vector_base<FirewirePort_*,_std::allocator<FirewirePort_*>_>._M_impl.
         super__Vector_impl_data._M_finish + -1;
  }
  raw1394_destroy_handle(this->handle);
  this->handle = (raw1394handle_t)0x0;
  return;
}

Assistant:

void FirewirePort::Cleanup(void)
{
    PortListType::iterator it = std::find(PortList.begin(), PortList.end(), this);
    if (it == PortList.end())
        outStr << "FirewirePort::Cleanup: could not find entry for port " << PortNum << std::endl;
    else
        PortList.erase(it);
    raw1394_destroy_handle(handle);
    handle = NULL;
}